

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int *in_RSI;
  char **in_stack_ffffffffffffffe8;
  
  printf("Running main() from %s\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/nmoinvaz[P]zlib-ng/test/test_main.cc"
        );
  cpu_check_features((cpu_features *)0x151e26);
  testing::InitGoogleTest(in_RSI,in_stack_ffffffffffffffe8);
  iVar1 = RUN_ALL_TESTS();
  return iVar1;
}

Assistant:

GTEST_API_ int main(int argc, char **argv) {
  printf("Running main() from %s\n", __FILE__);
#ifndef DISABLE_RUNTIME_CPU_DETECTION
  cpu_check_features(&test_cpu_features);
#endif
  testing::InitGoogleTest(&argc, argv);
  return RUN_ALL_TESTS();
}